

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void map_free_all_(map_base_t *m)

{
  char *key;
  undefined8 *puVar1;
  map_iter_t iter;
  map_iter_t local_20;
  
  local_20.bucketidx = 0xffffffff;
  local_20.node = (map_node_t *)0x0;
  while( true ) {
    key = map_next_(m,&local_20);
    if (key == (char *)0x0) break;
    puVar1 = (undefined8 *)map_get_(m,key);
    if (puVar1 != (undefined8 *)0x0) {
      free((void *)*puVar1);
    }
  }
  return;
}

Assistant:

void map_free_all_(map_base_t *m) {
  const char *key;
  map_iter_t iter = map_iter(m);

  while ((key = map_next_(m, &iter))) {
    void **res = map_get_(m, key);
    if (res != NULL)
      free(*res);
  }
}